

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pooling.cpp
# Opt level: O1

void CoreMLConverter::convertCaffePooling(ConvertLayerParameters layerParameters)

{
  int iVar1;
  Rep *pRVar2;
  string *layerName;
  Type *pTVar3;
  Type *this;
  PoolingLayerParams *pPVar4;
  PoolingLayerParams_ValidCompletePadding *pPVar5;
  int iVar6;
  uint32 uVar7;
  void **ppvVar8;
  long lVar9;
  PoolingParameter *pPVar10;
  uint32 uVar11;
  long lVar12;
  long in_stack_00000008;
  RepeatedPtrFieldBase *in_stack_00000018;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  RepeatedPtrFieldBase *local_80;
  pointer local_78;
  string local_70;
  string local_50;
  
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),
                      *(int *)&((bottom.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p);
  this = google::protobuf::internal::RepeatedPtrFieldBase::
         Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                   (in_stack_00000018,(Type *)0x0);
  if (((pTVar3->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
     ((pTVar3->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"Must have 1 input and 1 output","");
    errorInCaffeProto(&local_d8,(pTVar3->name_).ptr_,(pTVar3->type_).ptr_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  local_80 = in_stack_00000018;
  local_78 = top.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar2 = (pTVar3->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar8 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar8 = (void **)0x0;
  }
  lVar12 = (long)(pTVar3->bottom_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar12 != 0) {
    lVar9 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_98,*(value_type **)((long)ppvVar8 + lVar9));
      lVar9 = lVar9 + 8;
    } while (lVar12 * 8 != lVar9);
  }
  pRVar2 = (pTVar3->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar8 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar8 = (void **)0x0;
  }
  lVar12 = (long)(pTVar3->top_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar12 != 0) {
    lVar9 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_b8,*(value_type **)((long)ppvVar8 + lVar9));
      lVar9 = lVar9 + 8;
    } while (lVar12 * 8 != lVar9);
  }
  convertCaffeMetadata
            ((pTVar3->name_).ptr_,&local_98,&local_b8,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_80,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_78);
  if (this->_oneof_case_[0] != 0x78) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this);
    this->_oneof_case_[0] = 0x78;
    pPVar4 = (PoolingLayerParams *)operator_new(0x58);
    CoreML::Specification::PoolingLayerParams::PoolingLayerParams(pPVar4);
    (this->layer_).pooling_ = pPVar4;
  }
  pPVar10 = pTVar3->pooling_param_;
  if (pPVar10 == (PoolingParameter *)0x0) {
    pPVar10 = (PoolingParameter *)&caffe::_PoolingParameter_default_instance_;
  }
  pPVar4 = (this->layer_).pooling_;
  if (pPVar10->pool_ == 2) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"pool method","");
    layerName = (pTVar3->name_).ptr_;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Pooling","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Stochastic","");
    unsupportedCaffeParrameterWithOption(&local_d8,layerName,&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((uint)pPVar10->pool_ < 2) {
    pPVar4->type_ = pPVar10->pool_;
  }
  if (pPVar10->global_pooling_ == true) {
    pPVar4->globalpooling_ = true;
  }
  if (((pPVar10->_has_bits_).has_bits_[0] & 4) == 0) {
    uVar11 = pPVar10->pad_h_;
    uVar7 = pPVar10->pad_w_;
  }
  else {
    uVar11 = pPVar10->pad_;
    uVar7 = uVar11;
  }
  if (pPVar4->_oneof_case_[0] != 0x20) {
    CoreML::Specification::PoolingLayerParams::clear_PoolingPaddingType(pPVar4);
    pPVar4->_oneof_case_[0] = 0x20;
    pPVar5 = (PoolingLayerParams_ValidCompletePadding *)operator_new(0x28);
    CoreML::Specification::PoolingLayerParams_ValidCompletePadding::
    PoolingLayerParams_ValidCompletePadding(pPVar5);
    (pPVar4->PoolingPaddingType_).includelastpixel_ = pPVar5;
  }
  pPVar5 = (pPVar4->PoolingPaddingType_).includelastpixel_;
  iVar1 = (pPVar5->paddingamounts_).total_size_;
  if ((pPVar5->paddingamounts_).current_size_ == iVar1) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pPVar5->paddingamounts_,iVar1 + 1);
  }
  iVar1 = (pPVar5->paddingamounts_).current_size_;
  (pPVar5->paddingamounts_).current_size_ = iVar1 + 1;
  ((pPVar5->paddingamounts_).rep_)->elements[iVar1] = (ulong)uVar11;
  if (pPVar4->_oneof_case_[0] != 0x20) {
    CoreML::Specification::PoolingLayerParams::clear_PoolingPaddingType(pPVar4);
    pPVar4->_oneof_case_[0] = 0x20;
    pPVar5 = (PoolingLayerParams_ValidCompletePadding *)operator_new(0x28);
    CoreML::Specification::PoolingLayerParams_ValidCompletePadding::
    PoolingLayerParams_ValidCompletePadding(pPVar5);
    (pPVar4->PoolingPaddingType_).includelastpixel_ = pPVar5;
  }
  pPVar5 = (pPVar4->PoolingPaddingType_).includelastpixel_;
  iVar1 = (pPVar5->paddingamounts_).total_size_;
  if ((pPVar5->paddingamounts_).current_size_ == iVar1) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pPVar5->paddingamounts_,iVar1 + 1);
  }
  iVar1 = (pPVar5->paddingamounts_).current_size_;
  (pPVar5->paddingamounts_).current_size_ = iVar1 + 1;
  ((pPVar5->paddingamounts_).rep_)->elements[iVar1] = (ulong)uVar7;
  if (((pPVar10->_has_bits_).has_bits_[0] & 0x800) == 0) {
    uVar11 = pPVar10->stride_h_;
    uVar7 = pPVar10->stride_w_;
  }
  else {
    uVar11 = pPVar10->stride_;
    uVar7 = uVar11;
  }
  iVar1 = (pPVar4->stride_).total_size_;
  if ((pPVar4->stride_).current_size_ == iVar1) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pPVar4->stride_,iVar1 + 1);
  }
  iVar1 = (pPVar4->stride_).current_size_;
  iVar6 = iVar1 + 1;
  (pPVar4->stride_).current_size_ = iVar6;
  ((pPVar4->stride_).rep_)->elements[iVar1] = (ulong)(uVar11 + (uVar11 == 0));
  iVar1 = (pPVar4->stride_).total_size_;
  if (iVar6 == iVar1) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pPVar4->stride_,iVar1 + 1);
  }
  iVar1 = (pPVar4->stride_).current_size_;
  (pPVar4->stride_).current_size_ = iVar1 + 1;
  ((pPVar4->stride_).rep_)->elements[iVar1] = (ulong)(uVar7 + (uVar7 == 0));
  if (((pPVar10->_has_bits_).has_bits_[0] & 2) == 0) {
    uVar11 = pPVar10->kernel_h_;
    uVar7 = pPVar10->kernel_w_;
  }
  else {
    uVar11 = pPVar10->kernel_size_;
    uVar7 = uVar11;
  }
  if ((uVar11 == 0 || uVar7 == 0) && (pPVar10->global_pooling_ == false)) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"Kernel size must be non-zero","");
    errorInCaffeProto(&local_d8,(pTVar3->name_).ptr_,(pTVar3->type_).ptr_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = (pPVar4->kernelsize_).total_size_;
  if ((pPVar4->kernelsize_).current_size_ == iVar1) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pPVar4->kernelsize_,iVar1 + 1);
  }
  iVar1 = (pPVar4->kernelsize_).current_size_;
  iVar6 = iVar1 + 1;
  (pPVar4->kernelsize_).current_size_ = iVar6;
  ((pPVar4->kernelsize_).rep_)->elements[iVar1] = (ulong)uVar11;
  iVar1 = (pPVar4->kernelsize_).total_size_;
  if (iVar6 == iVar1) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pPVar4->kernelsize_,iVar1 + 1);
  }
  iVar1 = (pPVar4->kernelsize_).current_size_;
  (pPVar4->kernelsize_).current_size_ = iVar1 + 1;
  ((pPVar4->kernelsize_).rep_)->elements[iVar1] = (ulong)uVar7;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void CoreMLConverter::convertCaffePooling(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    Specification::PoolingLayerParams* specLayerParams = specLayer->mutable_pooling();
    const caffe::PoolingParameter& caffeLayerParams = caffeLayer.pooling_param();
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.pool()==caffe::PoolingParameter::STOCHASTIC){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("pool method",caffeLayer.name(), "Pooling", "Stochastic");
    }
    //***************************************************************
    
    // Copy over the parameters.
    if (caffeLayerParams.pool() == caffe::PoolingParameter::MAX) {
        specLayerParams->set_type(Specification::PoolingLayerParams::MAX);
    } else if (caffeLayerParams.pool() == caffe::PoolingParameter::AVE) {
        specLayerParams->set_type(Specification::PoolingLayerParams::AVERAGE);
    }

    if (caffeLayerParams.global_pooling()) {
        specLayerParams->set_globalpooling(true);
    }

    uint32_t pad_h = 0;
    uint32_t pad_w = 0;
    if (caffeLayerParams.has_pad()){
        pad_h = caffeLayerParams.pad();
        pad_w = caffeLayerParams.pad();
    } else {
        pad_h = caffeLayerParams.pad_h();
        pad_w = caffeLayerParams.pad_w();
    }
    
    specLayerParams->mutable_includelastpixel()->add_paddingamounts(static_cast<uint64_t>(pad_h));
    specLayerParams->mutable_includelastpixel()->add_paddingamounts(static_cast<uint64_t>(pad_w));
    
    uint32_t stride_h = 0;
    uint32_t stride_w = 0;
    if (caffeLayerParams.has_stride()){
        stride_h = caffeLayerParams.stride();
        stride_w = caffeLayerParams.stride();
    } else {
        stride_h = caffeLayerParams.stride_h();
        stride_w = caffeLayerParams.stride_w();
    }
    if (stride_w == 0) {
        stride_w = 1;
    }
    if (stride_h == 0){
        stride_h = 1;
    }
    specLayerParams->add_stride(static_cast<uint64_t>(stride_h));
    specLayerParams->add_stride(static_cast<uint64_t>(stride_w));
    
    uint32_t kernel_h = 0;
    uint32_t kernel_w = 0;
    if (caffeLayerParams.has_kernel_size()){
        kernel_h = caffeLayerParams.kernel_size();
        kernel_w = caffeLayerParams.kernel_size();
    } else {
        kernel_h = caffeLayerParams.kernel_h();
        kernel_w = caffeLayerParams.kernel_w();
    }
    if((kernel_h == 0 || (kernel_w == 0)) && !(caffeLayerParams.global_pooling())){
        CoreMLConverter::errorInCaffeProto("Kernel size must be non-zero",caffeLayer.name(),caffeLayer.type());
    }
    
    specLayerParams->add_kernelsize(static_cast<uint64_t>(kernel_h));
    specLayerParams->add_kernelsize(static_cast<uint64_t>(kernel_w));
}